

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O2

void __thiscall
Reflection::StructImpl<Enterprise::Machine::Options>::limit_enum<Configurable::Display>
          (StructImpl<Enterprise::Machine::Options> *this,Display *t,...)

{
  ulong uVar1;
  char in_AL;
  int *piVar2;
  uint uVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  reference rVar5;
  va_list list;
  vector<bool,_std::allocator<bool>_> permitted_values;
  string name;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<bool,_std::allocator<bool>_>_>
  local_110;
  int local_c8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  name_of_abi_cxx11_(&name,this,t);
  if (name._M_string_length != 0) {
    std::vector<bool,_std::allocator<bool>_>::vector
              (&permitted_values,8,(allocator_type *)&local_110);
    list[0].overflow_arg_area = &stack0x00000008;
    uVar3 = 0x10;
    while( true ) {
      uVar4 = (ulong)uVar3;
      if (uVar4 < 0x29) {
        uVar3 = uVar3 + 8;
        piVar2 = (int *)((long)local_c8 + uVar4);
      }
      else {
        piVar2 = (int *)list[0].overflow_arg_area;
        list[0].overflow_arg_area = (void *)((long)list[0].overflow_arg_area + 8);
      }
      uVar4 = (ulong)*piVar2;
      if ((long)uVar4 < 0) break;
      uVar1 = (ulong)permitted_values.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
              ((long)permitted_values.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
              (long)permitted_values.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      if (uVar1 <= uVar4) {
        std::vector<bool,_std::allocator<bool>_>::resize(&permitted_values,uVar1 * 2,false);
      }
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](&permitted_values,uVar4);
      *rVar5._M_p = *rVar5._M_p | rVar5._M_mask;
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<bool,_std::allocator<bool>_>_>
    ::pair<std::vector<bool,_std::allocator<bool>_>_&,_true>(&local_110,&name,&permitted_values);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<bool,std::allocator<bool>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<bool,std::allocator<bool>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,std::vector<bool,std::allocator<bool>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<bool,std::allocator<bool>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<bool,std::allocator<bool>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&permitted_enum_values__abi_cxx11_,&local_110);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<bool,_std::allocator<bool>_>_>
    ::~pair(&local_110);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&permitted_values.super__Bvector_base<std::allocator<bool>_>);
  }
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void limit_enum(Type *t, ...) {
			const auto name = name_of(t);
			if(name.empty()) return;

			// The default vector size of '8' isn't especially scientific,
			// but I feel like it's a good choice.
			std::vector<bool> permitted_values(8);

			va_list list;
			va_start(list, t);
			while(true) {
				const int next = va_arg(list, int);
				if(next < 0) break;

				if(permitted_values.size() <= size_t(next)) {
					permitted_values.resize(permitted_values.size() << 1);
				}
				permitted_values[size_t(next)] = true;
			}
			va_end(list);

			permitted_enum_values_.emplace(std::make_pair(name, permitted_values));
		}